

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDXFilmEdgeReader.cpp
# Opt level: O0

Barcode * __thiscall
ZXing::OneD::DXFilmEdgeReader::decodePattern
          (DXFilmEdgeReader *this,int rowNumber,PatternView *next,
          unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
          *state)

{
  bool bVar1;
  bool bVar2;
  value_type vVar3;
  int iVar4;
  int iVar5;
  pointer pDVar6;
  byte *pbVar7;
  PatternView *in_RCX;
  int in_EDX;
  int __c;
  long in_RSI;
  char *__s;
  Barcode *in_RDI;
  float fVar8;
  int xStop;
  int frameNr;
  string txt;
  int generationNumber;
  int productNumber;
  uchar parityBit;
  int signalSum;
  int modules;
  BitArray dataBits;
  Clock *clock;
  int xStart;
  float minDataQuietZone;
  optional<ZXing::OneD::(anonymous_namespace)::Clock> clock_1;
  anon_class_1_0_00000001 Is4x1;
  DXFEState *dxState;
  undefined4 in_stack_fffffffffffffc78;
  int in_stack_fffffffffffffc7c;
  Error *in_stack_fffffffffffffc80;
  int in_stack_fffffffffffffc88;
  int in_stack_fffffffffffffc8c;
  DXFEState *in_stack_fffffffffffffc90;
  int in_stack_fffffffffffffc98;
  int in_stack_fffffffffffffc9c;
  undefined4 in_stack_fffffffffffffca0;
  int in_stack_fffffffffffffca4;
  undefined8 in_stack_fffffffffffffca8;
  DXFEState *in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcbc;
  undefined4 in_stack_fffffffffffffcc0;
  int in_stack_fffffffffffffcc4;
  string *this_00;
  undefined1 readerInit;
  undefined8 in_stack_fffffffffffffcf8;
  undefined8 in_stack_fffffffffffffd00;
  string *text;
  undefined4 in_stack_fffffffffffffd10;
  SymbologyIdentifier si;
  undefined8 in_stack_fffffffffffffd20;
  Error *in_stack_fffffffffffffd28;
  string local_1f8 [32];
  string local_1d8 [36];
  int local_1b4;
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  int local_110;
  int local_10c;
  uchar *local_108;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_100;
  byte local_f2;
  uchar *local_f0;
  uchar *local_e8;
  uchar *local_e0;
  int local_d4;
  Iterator local_d0;
  undefined8 uStack_c8;
  Iterator local_c0;
  Iterator puStack_b8;
  undefined4 local_ac;
  int local_a8;
  string local_98;
  int local_78;
  undefined4 local_74;
  Iterator local_58;
  undefined8 local_50;
  Iterator local_48;
  Iterator local_40;
  undefined1 local_31;
  pointer local_30;
  PatternView *local_20;
  int local_14;
  
  local_20 = in_RCX;
  local_14 = in_EDX;
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
                      *)0x29ab7e);
  if (!bVar1) {
    operator_new(0x28);
    anon_unknown_0::DXFEState::DXFEState((DXFEState *)in_stack_fffffffffffffc80);
    std::
    unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
    ::reset((unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
             *)in_stack_fffffffffffffc80,
            (pointer)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
    iVar4 = local_14;
    pDVar6 = std::
             unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
             ::get((unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
                    *)in_stack_fffffffffffffc80);
    *(int *)&pDVar6[1]._vptr_DecodingState = iVar4;
  }
  local_30 = std::
             unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
             ::get((unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
                    *)in_stack_fffffffffffffc80);
  bVar1 = ReaderOptions::tryRotate(*(ReaderOptions **)(in_RSI + 8));
  if ((!bVar1) && (local_14 < *(int *)&local_30[1]._vptr_DecodingState)) {
    memset(in_RDI,0,0xd8);
    Result::Result((Result *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
    return in_RDI;
  }
  local_31 = 0;
  FindLeftGuard<4,ZXing::OneD::DXFilmEdgeReader::decodePattern(int,ZXing::PatternView&,std::unique_ptr<ZXing::OneD::RowReader::DecodingState,std::default_delete<ZXing::OneD::RowReader::DecodingState>>&)const::__0>
            (&local_58,local_20,10);
  local_20->_data = local_58;
  *(undefined8 *)&local_20->_size = local_50;
  local_20->_base = local_48;
  local_20->_end = local_40;
  bVar1 = PatternView::isValid((PatternView *)in_stack_fffffffffffffc80);
  if (!bVar1) {
    memset(in_RDI,0,0xd8);
    Result::Result((Result *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
    return in_RDI;
  }
  anon_unknown_0::CheckForClock
            (in_stack_fffffffffffffca4,
             (PatternView *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional<ZXing::OneD::(anonymous_namespace)::Clock> *)0x29ad0b);
  if (bVar1) {
    std::optional<ZXing::OneD::(anonymous_namespace)::Clock>::operator*
              ((optional<ZXing::OneD::(anonymous_namespace)::Clock> *)0x29ad2e);
    anon_unknown_0::DXFEState::addClock
              (in_stack_fffffffffffffc90,
               (Clock *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    PatternView::skipSymbol((PatternView *)0x29ad4b);
    memset(in_RDI,0,0xd8);
    Result::Result((Result *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
    return in_RDI;
  }
  bVar1 = std::
          vector<ZXing::OneD::(anonymous_namespace)::Clock,_std::allocator<ZXing::OneD::(anonymous_namespace)::Clock>_>
          ::empty((vector<ZXing::OneD::(anonymous_namespace)::Clock,_std::allocator<ZXing::OneD::(anonymous_namespace)::Clock>_>
                   *)in_stack_fffffffffffffc90);
  if (bVar1) {
    memset(in_RDI,0,0xd8);
    Result::Result((Result *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
    return in_RDI;
  }
  local_74 = 0x3f000000;
  bVar1 = (anonymous_namespace)::IsPattern<5,5>
                    ((PatternView *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                     (FixedPattern<5,_5,_false> *)
                     CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                     (float)((ulong)in_stack_fffffffffffffcb0 >> 0x20));
  if (!bVar1) {
    memset(in_RDI,0,0xd8);
    Result::Result((Result *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
    return in_RDI;
  }
  local_78 = PatternView::pixelsInFront((PatternView *)in_stack_fffffffffffffc80);
  local_98.field_2._8_8_ =
       anon_unknown_0::DXFEState::findClock
                 (in_stack_fffffffffffffcb0,(int)((ulong)in_stack_fffffffffffffca8 >> 0x20),
                  (int)in_stack_fffffffffffffca8);
  if ((Clock *)local_98.field_2._8_8_ == (Clock *)0x0) {
    memset(in_RDI,0,0xd8);
    Result::Result((Result *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
    return in_RDI;
  }
  PatternView::skipSymbol((PatternView *)0x29ae7a);
  BitArray::BitArray((BitArray *)0x29ae87);
  while( true ) {
    bVar2 = PatternView::isValid(local_20,1);
    bVar1 = false;
    if (bVar2) {
      iVar4 = BitArray::size((BitArray *)in_stack_fffffffffffffc80);
      iVar5 = anon_unknown_0::Clock::dataLength((Clock *)local_98.field_2._8_8_);
      bVar1 = iVar4 < iVar5;
    }
    si = SUB84(in_stack_fffffffffffffd20,0);
    if (!bVar1) break;
    __s = (char *)0x0;
    vVar3 = PatternView::operator[](local_20,0);
    fVar8 = anon_unknown_0::Clock::moduleSize((Clock *)local_98.field_2._8_8_);
    local_a8 = (int)((float)vVar3 / fVar8 + 0.5);
    PatternView::index(local_20,__s,__c);
    BitArray::appendBits
              ((BitArray *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,
               in_stack_fffffffffffffc88);
    PatternView::shift(local_20,1);
  }
  iVar4 = BitArray::size((BitArray *)in_stack_fffffffffffffc80);
  iVar5 = anon_unknown_0::Clock::dataLength((Clock *)local_98.field_2._8_8_);
  if (iVar4 != iVar5) {
    in_RDI->_format = None;
    in_RDI->_ecLevel[0] = '\0';
    in_RDI->_ecLevel[1] = '\0';
    in_RDI->_ecLevel[2] = '\0';
    in_RDI->_ecLevel[3] = '\0';
    in_RDI->_version[0] = '\0';
    in_RDI->_version[1] = '\0';
    in_RDI->_version[2] = '\0';
    in_RDI->_version[3] = '\0';
    in_RDI->_lineCount = 0;
    (in_RDI->_sai).id.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(in_RDI->_sai).id.field_2 + 8) = 0;
    *(undefined8 *)&(in_RDI->_sai).id = 0;
    (in_RDI->_sai).id._M_string_length = 0;
    *(undefined8 *)&(in_RDI->_readerOpts)._formats = 0;
    (in_RDI->_sai).index = 0;
    (in_RDI->_sai).count = 0;
    (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
    (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
    *(undefined8 *)&in_RDI->_readerOpts = 0;
    (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
    (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
    (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
    (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
    (in_RDI->_error)._line = 0;
    (in_RDI->_error)._type = None;
    *(undefined5 *)&(in_RDI->_error).field_0x2b = 0;
    (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
    (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
    *(undefined8 *)((long)&(in_RDI->_error)._msg.field_2 + 8) = 0;
    (in_RDI->_error)._file = (char *)0x0;
    (in_RDI->_error)._msg._M_string_length = 0;
    (in_RDI->_error)._msg.field_2._M_allocated_capacity = 0;
    (in_RDI->_content).symbology.code = '\0';
    (in_RDI->_content).symbology.modifier = '\0';
    (in_RDI->_content).symbology.eciModifierOffset = '\0';
    (in_RDI->_content).symbology.aiFlag = None;
    (in_RDI->_content).defaultCharset = Unknown;
    (in_RDI->_content).hasECI = false;
    *(undefined2 *)&(in_RDI->_content).field_0x36 = 0;
    *(undefined8 *)&(in_RDI->_error)._msg = 0;
    (in_RDI->_content).encodings.
    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (in_RDI->_content).encodings.
    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (in_RDI->_content).encodings.
    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    in_RDI->_isMirrored = false;
    in_RDI->_isInverted = false;
    in_RDI->_readerInit = false;
    *(undefined5 *)&in_RDI->field_0xd3 = 0;
    Result::Result((Result *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
    local_ac = 1;
    goto LAB_0029b9c0;
  }
  FixedPattern<3,_3,_false>::size
            ((FixedPattern<3,_3,_false> *)&(anonymous_namespace)::DATA_STOP_PATTERN);
  PatternView::subView
            ((PatternView *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
             in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98);
  local_20->_base = local_c0;
  local_20->_end = puStack_b8;
  local_20->_data = local_d0;
  *(undefined8 *)&local_20->_size = uStack_c8;
  bVar1 = PatternView::isValid((PatternView *)in_stack_fffffffffffffc80);
  if ((!bVar1) ||
     (bVar1 = IsRightGuard<3,3,false>
                        ((PatternView *)in_stack_fffffffffffffc90,
                         (FixedPattern<3,_3,_false> *)
                         CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                         (double)in_stack_fffffffffffffc80,
                         (double)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78)),
     !bVar1)) {
    in_RDI->_format = None;
    in_RDI->_ecLevel[0] = '\0';
    in_RDI->_ecLevel[1] = '\0';
    in_RDI->_ecLevel[2] = '\0';
    in_RDI->_ecLevel[3] = '\0';
    in_RDI->_version[0] = '\0';
    in_RDI->_version[1] = '\0';
    in_RDI->_version[2] = '\0';
    in_RDI->_version[3] = '\0';
    in_RDI->_lineCount = 0;
    (in_RDI->_sai).id.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(in_RDI->_sai).id.field_2 + 8) = 0;
    *(undefined8 *)&(in_RDI->_sai).id = 0;
    (in_RDI->_sai).id._M_string_length = 0;
    *(undefined8 *)&(in_RDI->_readerOpts)._formats = 0;
    (in_RDI->_sai).index = 0;
    (in_RDI->_sai).count = 0;
    (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
    (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
    *(undefined8 *)&in_RDI->_readerOpts = 0;
    (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
    (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
    (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
    (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
    (in_RDI->_error)._line = 0;
    (in_RDI->_error)._type = None;
    *(undefined5 *)&(in_RDI->_error).field_0x2b = 0;
    (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
    (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
    *(undefined8 *)((long)&(in_RDI->_error)._msg.field_2 + 8) = 0;
    (in_RDI->_error)._file = (char *)0x0;
    (in_RDI->_error)._msg._M_string_length = 0;
    (in_RDI->_error)._msg.field_2._M_allocated_capacity = 0;
    (in_RDI->_content).symbology.code = '\0';
    (in_RDI->_content).symbology.modifier = '\0';
    (in_RDI->_content).symbology.eciModifierOffset = '\0';
    (in_RDI->_content).symbology.aiFlag = None;
    (in_RDI->_content).defaultCharset = Unknown;
    (in_RDI->_content).hasECI = false;
    *(undefined2 *)&(in_RDI->_content).field_0x36 = 0;
    *(undefined8 *)&(in_RDI->_error)._msg = 0;
    (in_RDI->_content).encodings.
    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (in_RDI->_content).encodings.
    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (in_RDI->_content).encodings.
    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    in_RDI->_isMirrored = false;
    in_RDI->_isInverted = false;
    in_RDI->_readerInit = false;
    *(undefined5 *)&in_RDI->field_0xd3 = 0;
    Result::Result((Result *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
    local_ac = 1;
    goto LAB_0029b9c0;
  }
  bVar1 = BitArray::get((BitArray *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
  if ((!bVar1) &&
     (bVar1 = BitArray::get((BitArray *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c), !bVar1
     )) {
    if ((*(byte *)local_98.field_2._8_8_ & 1) == 0) {
      bVar1 = BitArray::get((BitArray *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
    }
    else {
      bVar1 = BitArray::get((BitArray *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
      if (bVar1) goto LAB_0029b2b7;
      bVar1 = BitArray::get((BitArray *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
    }
    if (!bVar1) {
      text = &local_98;
      local_e0 = (uchar *)BitArray::begin((BitArray *)
                                          CONCAT44(in_stack_fffffffffffffc7c,
                                                   in_stack_fffffffffffffc78));
      local_f0 = (uchar *)BitArray::end((BitArray *)
                                        CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78
                                                ));
      local_e8 = (uchar *)__gnu_cxx::
                          __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          ::operator-((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                       *)CONCAT44(in_stack_fffffffffffffc8c,
                                                  in_stack_fffffffffffffc88),
                                      (difference_type)in_stack_fffffffffffffc80);
      iVar4 = Reduce<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,int,std::plus<int>>
                        (local_e0,local_e8,0);
      local_d4 = iVar4;
      local_108 = (uchar *)BitArray::end((BitArray *)
                                         CONCAT44(in_stack_fffffffffffffc7c,
                                                  in_stack_fffffffffffffc78));
      local_100 = __gnu_cxx::
                  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator-((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                               *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                              (difference_type)in_stack_fffffffffffffc80);
      pbVar7 = __gnu_cxx::
               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator*(&local_100);
      local_f2 = *pbVar7;
      if (local_d4 % 2 == (uint)local_f2) {
        iVar5 = ToInt<int,void>((BitArray *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,
                                in_stack_fffffffffffffc88);
        local_10c = iVar5;
        if (iVar5 == 0) {
          in_RDI->_format = None;
          in_RDI->_ecLevel[0] = '\0';
          in_RDI->_ecLevel[1] = '\0';
          in_RDI->_ecLevel[2] = '\0';
          in_RDI->_ecLevel[3] = '\0';
          in_RDI->_version[0] = '\0';
          in_RDI->_version[1] = '\0';
          in_RDI->_version[2] = '\0';
          in_RDI->_version[3] = '\0';
          in_RDI->_lineCount = 0;
          (in_RDI->_sai).id.field_2._M_allocated_capacity = 0;
          *(undefined8 *)((long)&(in_RDI->_sai).id.field_2 + 8) = 0;
          *(undefined8 *)&(in_RDI->_sai).id = 0;
          (in_RDI->_sai).id._M_string_length = 0;
          *(undefined8 *)&(in_RDI->_readerOpts)._formats = 0;
          (in_RDI->_sai).index = 0;
          (in_RDI->_sai).count = 0;
          (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
          (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
          *(undefined8 *)&in_RDI->_readerOpts = 0;
          (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
          (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
          (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
          (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
          (in_RDI->_error)._line = 0;
          (in_RDI->_error)._type = None;
          *(undefined5 *)&(in_RDI->_error).field_0x2b = 0;
          (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
          (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
          *(undefined8 *)((long)&(in_RDI->_error)._msg.field_2 + 8) = 0;
          (in_RDI->_error)._file = (char *)0x0;
          (in_RDI->_error)._msg._M_string_length = 0;
          (in_RDI->_error)._msg.field_2._M_allocated_capacity = 0;
          (in_RDI->_content).symbology.code = '\0';
          (in_RDI->_content).symbology.modifier = '\0';
          (in_RDI->_content).symbology.eciModifierOffset = '\0';
          (in_RDI->_content).symbology.aiFlag = None;
          (in_RDI->_content).defaultCharset = Unknown;
          (in_RDI->_content).hasECI = false;
          *(undefined2 *)&(in_RDI->_content).field_0x36 = 0;
          *(undefined8 *)&(in_RDI->_error)._msg = 0;
          (in_RDI->_content).encodings.
          super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (in_RDI->_content).encodings.
          super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (in_RDI->_content).encodings.
          super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          in_RDI->_isMirrored = false;
          in_RDI->_isInverted = false;
          in_RDI->_readerInit = false;
          *(undefined5 *)&in_RDI->field_0xd3 = 0;
          Result::Result((Result *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
          local_ac = 1;
        }
        else {
          local_110 = ToInt<int,void>((BitArray *)in_stack_fffffffffffffc90,
                                      in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88);
          readerInit = (undefined1)((uint)iVar5 >> 0x18);
          this_00 = local_130;
          std::__cxx11::string::string(this_00);
          std::__cxx11::string::reserve((ulong)this_00);
          iVar5 = (int)((ulong)this_00 >> 0x20);
          std::__cxx11::to_string(iVar5);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                         (char *)in_stack_fffffffffffffc80);
          std::__cxx11::to_string(iVar5);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffcb0);
          std::__cxx11::string::operator=(local_130,local_150);
          std::__cxx11::string::~string(local_150);
          std::__cxx11::string::~string(local_1b0);
          std::__cxx11::string::~string(local_170);
          std::__cxx11::string::~string(local_190);
          if ((*(byte *)local_98.field_2._8_8_ & 1) != 0) {
            in_stack_fffffffffffffcc4 =
                 ToInt<int,void>((BitArray *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,
                                 in_stack_fffffffffffffc88);
            local_1b4 = in_stack_fffffffffffffcc4;
            std::__cxx11::to_string(iVar5);
            std::operator+((char *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                           &in_stack_fffffffffffffc80->_msg);
            std::__cxx11::string::operator+=(local_130,local_1d8);
            std::__cxx11::string::~string(local_1d8);
            std::__cxx11::string::~string(local_1f8);
            bVar1 = BitArray::get((BitArray *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
            in_stack_fffffffffffffcc0 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffcc0);
            if (bVar1) {
              std::__cxx11::string::operator+=(local_130,"A");
            }
          }
          iVar5 = PatternView::pixelsTillEnd((PatternView *)in_stack_fffffffffffffc80);
          bVar1 = anon_unknown_0::Clock::isCloseToStop
                            ((Clock *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,
                             in_stack_fffffffffffffc88);
          if (bVar1) {
            *(int *)(local_98.field_2._8_8_ + 8) = local_78;
            *(int *)(local_98.field_2._8_8_ + 0xc) = iVar5;
            Error::Error(in_stack_fffffffffffffc80);
            Result::Result((Result *)CONCAT44(iVar4,in_stack_fffffffffffffd10),text,
                           (int)((ulong)in_stack_fffffffffffffd00 >> 0x20),
                           (int)in_stack_fffffffffffffd00,
                           (int)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
                           (BarcodeFormat)in_stack_fffffffffffffcf8,si,in_stack_fffffffffffffd28,
                           (bool)readerInit);
            Error::~Error((Error *)0x29b972);
          }
          else {
            in_RDI->_format = None;
            in_RDI->_ecLevel[0] = '\0';
            in_RDI->_ecLevel[1] = '\0';
            in_RDI->_ecLevel[2] = '\0';
            in_RDI->_ecLevel[3] = '\0';
            in_RDI->_version[0] = '\0';
            in_RDI->_version[1] = '\0';
            in_RDI->_version[2] = '\0';
            in_RDI->_version[3] = '\0';
            in_RDI->_lineCount = 0;
            (in_RDI->_sai).id.field_2._M_allocated_capacity = 0;
            *(undefined8 *)((long)&(in_RDI->_sai).id.field_2 + 8) = 0;
            *(undefined8 *)&(in_RDI->_sai).id = 0;
            (in_RDI->_sai).id._M_string_length = 0;
            *(undefined8 *)&(in_RDI->_readerOpts)._formats = 0;
            (in_RDI->_sai).index = 0;
            (in_RDI->_sai).count = 0;
            (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
            (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
            *(undefined8 *)&in_RDI->_readerOpts = 0;
            (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
            (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
            (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
            (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
            (in_RDI->_error)._line = 0;
            (in_RDI->_error)._type = None;
            *(undefined5 *)&(in_RDI->_error).field_0x2b = 0;
            (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
            (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
            *(undefined8 *)((long)&(in_RDI->_error)._msg.field_2 + 8) = 0;
            (in_RDI->_error)._file = (char *)0x0;
            (in_RDI->_error)._msg._M_string_length = 0;
            (in_RDI->_error)._msg.field_2._M_allocated_capacity = 0;
            (in_RDI->_content).symbology.code = '\0';
            (in_RDI->_content).symbology.modifier = '\0';
            (in_RDI->_content).symbology.eciModifierOffset = '\0';
            (in_RDI->_content).symbology.aiFlag = None;
            (in_RDI->_content).defaultCharset = Unknown;
            (in_RDI->_content).hasECI = false;
            *(undefined2 *)&(in_RDI->_content).field_0x36 = 0;
            *(undefined8 *)&(in_RDI->_error)._msg = 0;
            (in_RDI->_content).encodings.
            super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (in_RDI->_content).encodings.
            super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (in_RDI->_content).encodings.
            super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            in_RDI->_isMirrored = false;
            in_RDI->_isInverted = false;
            in_RDI->_readerInit = false;
            *(undefined5 *)&in_RDI->field_0xd3 = 0;
            Result::Result((Result *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
          }
          local_ac = 1;
          std::__cxx11::string::~string(local_130);
        }
      }
      else {
        in_RDI->_format = None;
        in_RDI->_ecLevel[0] = '\0';
        in_RDI->_ecLevel[1] = '\0';
        in_RDI->_ecLevel[2] = '\0';
        in_RDI->_ecLevel[3] = '\0';
        in_RDI->_version[0] = '\0';
        in_RDI->_version[1] = '\0';
        in_RDI->_version[2] = '\0';
        in_RDI->_version[3] = '\0';
        in_RDI->_lineCount = 0;
        (in_RDI->_sai).id.field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&(in_RDI->_sai).id.field_2 + 8) = 0;
        *(undefined8 *)&(in_RDI->_sai).id = 0;
        (in_RDI->_sai).id._M_string_length = 0;
        *(undefined8 *)&(in_RDI->_readerOpts)._formats = 0;
        (in_RDI->_sai).index = 0;
        (in_RDI->_sai).count = 0;
        (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
        (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
        *(undefined8 *)&in_RDI->_readerOpts = 0;
        (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
        (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
        (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
        (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
        (in_RDI->_error)._line = 0;
        (in_RDI->_error)._type = None;
        *(undefined5 *)&(in_RDI->_error).field_0x2b = 0;
        (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
        (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
        *(undefined8 *)((long)&(in_RDI->_error)._msg.field_2 + 8) = 0;
        (in_RDI->_error)._file = (char *)0x0;
        (in_RDI->_error)._msg._M_string_length = 0;
        (in_RDI->_error)._msg.field_2._M_allocated_capacity = 0;
        (in_RDI->_content).symbology.code = '\0';
        (in_RDI->_content).symbology.modifier = '\0';
        (in_RDI->_content).symbology.eciModifierOffset = '\0';
        (in_RDI->_content).symbology.aiFlag = None;
        (in_RDI->_content).defaultCharset = Unknown;
        (in_RDI->_content).hasECI = false;
        *(undefined2 *)&(in_RDI->_content).field_0x36 = 0;
        *(undefined8 *)&(in_RDI->_error)._msg = 0;
        (in_RDI->_content).encodings.
        super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (in_RDI->_content).encodings.
        super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (in_RDI->_content).encodings.
        super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        in_RDI->_isMirrored = false;
        in_RDI->_isInverted = false;
        in_RDI->_readerInit = false;
        *(undefined5 *)&in_RDI->field_0xd3 = 0;
        Result::Result((Result *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
        local_ac = 1;
      }
      goto LAB_0029b9c0;
    }
  }
LAB_0029b2b7:
  in_RDI->_format = None;
  in_RDI->_ecLevel[0] = '\0';
  in_RDI->_ecLevel[1] = '\0';
  in_RDI->_ecLevel[2] = '\0';
  in_RDI->_ecLevel[3] = '\0';
  in_RDI->_version[0] = '\0';
  in_RDI->_version[1] = '\0';
  in_RDI->_version[2] = '\0';
  in_RDI->_version[3] = '\0';
  in_RDI->_lineCount = 0;
  (in_RDI->_sai).id.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(in_RDI->_sai).id.field_2 + 8) = 0;
  *(undefined8 *)&(in_RDI->_sai).id = 0;
  (in_RDI->_sai).id._M_string_length = 0;
  *(undefined8 *)&(in_RDI->_readerOpts)._formats = 0;
  (in_RDI->_sai).index = 0;
  (in_RDI->_sai).count = 0;
  (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
  (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
  *(undefined8 *)&in_RDI->_readerOpts = 0;
  (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
  (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
  (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
  (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
  (in_RDI->_error)._line = 0;
  (in_RDI->_error)._type = None;
  *(undefined5 *)&(in_RDI->_error).field_0x2b = 0;
  (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
  (in_RDI->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
  *(undefined8 *)((long)&(in_RDI->_error)._msg.field_2 + 8) = 0;
  (in_RDI->_error)._file = (char *)0x0;
  (in_RDI->_error)._msg._M_string_length = 0;
  (in_RDI->_error)._msg.field_2._M_allocated_capacity = 0;
  (in_RDI->_content).symbology.code = '\0';
  (in_RDI->_content).symbology.modifier = '\0';
  (in_RDI->_content).symbology.eciModifierOffset = '\0';
  (in_RDI->_content).symbology.aiFlag = None;
  (in_RDI->_content).defaultCharset = Unknown;
  (in_RDI->_content).hasECI = false;
  *(undefined2 *)&(in_RDI->_content).field_0x36 = 0;
  *(undefined8 *)&(in_RDI->_error)._msg = 0;
  (in_RDI->_content).encodings.
  super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->_content).encodings.
  super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (in_RDI->_content).encodings.
  super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  in_RDI->_isMirrored = false;
  in_RDI->_isInverted = false;
  in_RDI->_readerInit = false;
  *(undefined5 *)&in_RDI->field_0xd3 = 0;
  Result::Result((Result *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  local_ac = 1;
LAB_0029b9c0:
  BitArray::~BitArray((BitArray *)0x29b9cd);
  return in_RDI;
}

Assistant:

Barcode DXFilmEdgeReader::decodePattern(int rowNumber, PatternView& next, std::unique_ptr<DecodingState>& state) const
{
	if (!state) {
		state.reset(new DXFEState);
		static_cast<DXFEState*>(state.get())->centerRow = rowNumber;
	}

	auto dxState = static_cast<DXFEState*>(state.get());

	// Only consider rows below the center row of the image
	if (!_opts.tryRotate() && rowNumber < dxState->centerRow)
		return {};

	// Look for a pattern that is part of both the clock as well as the data track (ommitting the first bar)
	constexpr auto Is4x1 = [](const PatternView& view, int spaceInPixel) {
		// find min/max of 4 consecutive bars/spaces and make sure they are close together
		auto [m, M] = std::minmax({view[1], view[2], view[3], view[4]});
		return M <= m * 4 / 3 + 1 && spaceInPixel > m / 2;
	};

	// 12 is the minimum size of the data track (at least one product class bit + one parity bit)
	next = FindLeftGuard<4>(next, 10, Is4x1);
	if (!next.isValid())
		return {};

	// Check if the 4x1 pattern is part of a clock track
	if (auto clock = CheckForClock(rowNumber, next)) {
		dxState->addClock(*clock);
		next.skipSymbol();
		return {};
	}

	// Without at least one clock track, we stop here
	if (dxState->clocks.empty())
		return {};

	constexpr float minDataQuietZone = 0.5;

	if (!IsPattern(next, DATA_START_PATTERN, minDataQuietZone))
		return {};

	auto xStart = next.pixelsInFront();

	// Only consider data tracks that are next to a clock track
	auto clock = dxState->findClock(xStart, rowNumber);
	if (!clock)
		return {};

	// Skip the data start pattern (black, white, black, white, black)
	// The first signal bar is always white: this is the
	// separation between the start pattern and the product number
	next.skipSymbol();

	// Read the data bits
	BitArray dataBits;
	while (next.isValid(1) && dataBits.size() < clock->dataLength()) {

		int modules = int(next[0] / clock->moduleSize() + 0.5);
		// even index means we are at a bar, otherwise at a space
		dataBits.appendBits(next.index() % 2 == 0 ? 0xFFFFFFFF : 0x0, modules);

		next.shift(1);
	}

	// Check the data track length
	if (dataBits.size() != clock->dataLength())
		return {};

	next = next.subView(0, DATA_STOP_PATTERN.size());

	// Check there is the Stop pattern at the end of the data track
	if (!next.isValid() || !IsRightGuard(next, DATA_STOP_PATTERN, minDataQuietZone))
		return {};

	// The following bits are always white (=false), they are separators.
	if (dataBits.get(0) || dataBits.get(8) || (clock->hasFrameNr ? (dataBits.get(20) || dataBits.get(22)) : dataBits.get(14)))
		return {};

	// Check the parity bit
	auto signalSum = Reduce(dataBits.begin(), dataBits.end() - 2, 0);
	auto parityBit = *(dataBits.end() - 2);
	if (signalSum % 2 != (int)parityBit)
		return {};

	// Compute the DX 1 number (product number)
	auto productNumber = ToInt(dataBits, 1, 7);
	if (!productNumber)
		return {};

	// Compute the DX 2 number (generation number)
	auto generationNumber = ToInt(dataBits, 9, 4);

	// Generate the textual representation.
	// Eg: 115-10/11A means: DX1 = 115, DX2 = 10, Frame number = 11A
	std::string txt;
	txt.reserve(10);
	txt = std::to_string(productNumber) + "-" + std::to_string(generationNumber);
	if (clock->hasFrameNr) {
		auto frameNr = ToInt(dataBits, 13, 6);
		txt += "/" + std::to_string(frameNr);
		if (dataBits.get(19))
			txt += "A";
	}

	auto xStop = next.pixelsTillEnd();

	// The found data track must end near the clock track
	if (!clock->isCloseToStop(xStop, rowNumber))
		return {};

	// Update the clock coordinates with the latest corresponding data track
	// This may improve signal detection for next row iterations
	clock->xStart = xStart;
	clock->xStop = xStop;

	return Barcode(txt, rowNumber, xStart, xStop, BarcodeFormat::DXFilmEdge, {});
}